

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O1

void Spl_ManStop(Spl_Man_t *p)

{
  Gia_Man_t *pGVar1;
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  Vec_Bit_t *pVVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  long lVar5;
  
  Gia_ManStaticFanoutStop(p->pGia);
  pGVar1 = p->pGia;
  if (pGVar1->vMapping != (Vec_Int_t *)0x0) {
    __assert_fail("!Gia_ManHasMapping(p->pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                  ,0x99,"void Spl_ManStop(Spl_Man_t *)");
  }
  if (pGVar1->vMapping2 != (Vec_Wec_t *)0x0) {
    pVVar3 = Spl_ManFromWecMapping(pGVar1,pGVar1->vMapping2);
    pGVar1 = p->pGia;
    pGVar1->vMapping = pVVar3;
    __ptr = pGVar1->vMapping2;
    if (__ptr != (Vec_Wec_t *)0x0) {
      if (0 < __ptr->nCap) {
        lVar4 = 8;
        lVar5 = 0;
        do {
          __ptr_00 = *(void **)((long)&__ptr->pArray->nCap + lVar4);
          if (__ptr_00 != (void *)0x0) {
            free(__ptr_00);
            *(undefined8 *)((long)&__ptr->pArray->nCap + lVar4) = 0;
          }
          lVar5 = lVar5 + 1;
          lVar4 = lVar4 + 0x10;
        } while (lVar5 < __ptr->nCap);
      }
      if (__ptr->pArray != (Vec_Int_t *)0x0) {
        free(__ptr->pArray);
        __ptr->pArray = (Vec_Int_t *)0x0;
      }
      __ptr->nCap = 0;
      __ptr->nSize = 0;
      free(__ptr);
      pGVar1->vMapping2 = (Vec_Wec_t *)0x0;
    }
    pVVar2 = p->vMarksCIO;
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (int *)0x0;
    }
    if (pVVar2 != (Vec_Bit_t *)0x0) {
      free(pVVar2);
    }
    pVVar2 = p->vMarksIn;
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (int *)0x0;
    }
    if (pVVar2 != (Vec_Bit_t *)0x0) {
      free(pVVar2);
    }
    pVVar2 = p->vMarksNo;
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (int *)0x0;
    }
    if (pVVar2 != (Vec_Bit_t *)0x0) {
      free(pVVar2);
    }
    pVVar2 = p->vMarksAnd;
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (int *)0x0;
    }
    if (pVVar2 != (Vec_Bit_t *)0x0) {
      free(pVVar2);
    }
    pVVar3 = p->vRoots;
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (int *)0x0;
    }
    if (pVVar3 != (Vec_Int_t *)0x0) {
      free(pVVar3);
    }
    pVVar3 = p->vNodes;
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (int *)0x0;
    }
    if (pVVar3 != (Vec_Int_t *)0x0) {
      free(pVVar3);
    }
    pVVar3 = p->vLeaves;
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (int *)0x0;
    }
    if (pVVar3 != (Vec_Int_t *)0x0) {
      free(pVVar3);
    }
    pVVar3 = p->vAnds;
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (int *)0x0;
    }
    if (pVVar3 != (Vec_Int_t *)0x0) {
      free(pVVar3);
    }
    pVVar3 = p->vFanouts;
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (int *)0x0;
    }
    if (pVVar3 != (Vec_Int_t *)0x0) {
      free(pVVar3);
    }
    pVVar3 = p->vCands;
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (int *)0x0;
    }
    if (pVVar3 != (Vec_Int_t *)0x0) {
      free(pVVar3);
    }
    pVVar3 = p->vInputs;
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (int *)0x0;
    }
    if (pVVar3 != (Vec_Int_t *)0x0) {
      free(pVVar3);
    }
    free(p);
    return;
  }
  __assert_fail("Gia_ManHasMapping2(p->pGia)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                ,0x9a,"void Spl_ManStop(Spl_Man_t *)");
}

Assistant:

void Spl_ManStop( Spl_Man_t * p )
{
    // fanout
    Gia_ManStaticFanoutStop( p->pGia );
    // mapping
    assert( !Gia_ManHasMapping(p->pGia) );
    assert( Gia_ManHasMapping2(p->pGia) );
    p->pGia->vMapping = Spl_ManFromWecMapping( p->pGia, p->pGia->vMapping2 );
    Vec_WecFreeP( &p->pGia->vMapping2 );
    // intermediate
    Vec_BitFree( p->vMarksCIO );
    Vec_BitFree( p->vMarksIn );
    Vec_BitFree( p->vMarksNo );
    Vec_BitFree( p->vMarksAnd );
    Vec_IntFree( p->vRoots );
    Vec_IntFree( p->vNodes );
    Vec_IntFree( p->vLeaves );
    Vec_IntFree( p->vAnds );
    // temporary 
    Vec_IntFree( p->vFanouts );
    Vec_IntFree( p->vCands );
    Vec_IntFree( p->vInputs );
    ABC_FREE( p );
}